

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O3

int libssh2_channel_setenv_ex
              (LIBSSH2_CHANNEL *channel,char *varname,uint varname_len,char *value,uint value_len)

{
  uchar uVar1;
  libssh2_nonblocking_states lVar2;
  LIBSSH2_SESSION *pLVar3;
  int iVar4;
  time_t start_time;
  uchar *puVar5;
  char *errmsg;
  ulong uVar6;
  uchar *local_78;
  uchar *local_70;
  time_t local_68;
  ulong local_60;
  ulong local_58;
  char *local_50;
  char *local_48;
  size_t local_40;
  uchar *data;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    return -0x27;
  }
  local_50 = varname;
  local_48 = value;
  start_time = time((time_t *)0x0);
  uVar6 = (ulong)(varname_len + value_len + 0x15);
  local_70 = channel->setenv_local_channel;
  local_60 = (ulong)varname_len;
  local_58 = (ulong)value_len;
  do {
    pLVar3 = channel->session;
    lVar2 = channel->setenv_state;
    if (lVar2 == libssh2_NB_state_sent) {
LAB_00120b2b:
      iVar4 = _libssh2_packet_requirev
                        (pLVar3,"cd",&data,&local_40,1,local_70,4,
                         &channel->setenv_packet_requirev_state);
      if (iVar4 != -0x25) {
        if (iVar4 == 0) {
          if (local_40 != 0) {
            uVar1 = *data;
            local_68 = start_time;
            (*pLVar3->free)(data,&pLVar3->abstract);
            start_time = local_68;
            if (uVar1 == 'c') {
              channel->setenv_state = libssh2_NB_state_idle;
              return 0;
            }
            goto LAB_00120ba0;
          }
          channel->setenv_state = libssh2_NB_state_idle;
          iVar4 = -0xe;
          errmsg = "Unexpected packet size";
        }
        else {
          channel->setenv_state = libssh2_NB_state_idle;
          errmsg = "Failed getting response for channel-setenv";
        }
LAB_00120c35:
        iVar4 = _libssh2_error(pLVar3,iVar4,errmsg);
        if (iVar4 != -0x25) {
          return iVar4;
        }
      }
    }
    else {
      if (lVar2 != libssh2_NB_state_created) {
        if (lVar2 == libssh2_NB_state_idle) {
          channel->setenv_packet_len = uVar6;
          (channel->setenv_packet_requirev_state).start = 0;
          puVar5 = (uchar *)(*pLVar3->alloc)(uVar6,&pLVar3->abstract);
          channel->setenv_packet = puVar5;
          if (puVar5 != (uchar *)0x0) {
            local_78 = puVar5 + 1;
            *puVar5 = 'b';
            _libssh2_store_u32(&local_78,(channel->remote).id);
            _libssh2_store_str(&local_78,"env",3);
            *local_78 = '\x01';
            local_78 = local_78 + 1;
            _libssh2_store_str(&local_78,local_50,local_60);
            _libssh2_store_str(&local_78,local_48,local_58);
            channel->setenv_state = libssh2_NB_state_created;
            goto LAB_00120ab8;
          }
          iVar4 = -6;
          errmsg = "Unable to allocate memory for setenv packet";
        }
        else {
LAB_00120ba0:
          channel->setenv_state = libssh2_NB_state_idle;
          iVar4 = -0x16;
          errmsg = "Unable to complete request for channel-setenv";
        }
        goto LAB_00120c35;
      }
LAB_00120ab8:
      iVar4 = _libssh2_transport_send
                        (pLVar3,channel->setenv_packet,channel->setenv_packet_len,(uchar *)0x0,0);
      if (iVar4 == 0) {
        (*pLVar3->free)(channel->setenv_packet,&pLVar3->abstract);
        channel->setenv_packet = (uchar *)0x0;
        _libssh2_htonu32(local_70,(channel->local).id);
        channel->setenv_state = libssh2_NB_state_sent;
        goto LAB_00120b2b;
      }
      if (iVar4 != -0x25) {
        (*pLVar3->free)(channel->setenv_packet,&pLVar3->abstract);
        channel->setenv_packet = (uchar *)0x0;
        channel->setenv_state = libssh2_NB_state_idle;
        iVar4 = -7;
        errmsg = "Unable to send channel-request packet for setenv request";
        goto LAB_00120c35;
      }
      _libssh2_error(pLVar3,-0x25,"Would block sending setenv request");
    }
    pLVar3 = channel->session;
    if (pLVar3 == (LIBSSH2_SESSION *)0x0) {
      return -0x25;
    }
    if (pLVar3->api_block_mode == 0) {
      return -0x25;
    }
    iVar4 = _libssh2_wait_socket(pLVar3,start_time);
    if (iVar4 != 0) {
      return iVar4;
    }
  } while( true );
}

Assistant:

LIBSSH2_API int
libssh2_channel_setenv_ex(LIBSSH2_CHANNEL *channel,
                          const char *varname, unsigned int varname_len,
                          const char *value, unsigned int value_len)
{
    int rc;

    if(!channel)
        return LIBSSH2_ERROR_BAD_USE;

    BLOCK_ADJUST(rc, channel->session,
                 channel_setenv(channel, varname, varname_len,
                                value, value_len));
    return rc;
}